

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O1

size_t absl::strings_internal::memcspn(char *s,size_t slen,char *reject)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *p;
  char *pcVar4;
  char *pcVar5;
  
  pcVar3 = s;
  if (slen != 0) {
    pcVar1 = s + slen;
    pcVar4 = s;
    do {
      pcVar3 = pcVar4;
      slen = slen - 1;
      pcVar4 = pcVar3 + 1;
      pcVar5 = reject;
      while (cVar2 = *pcVar5, cVar2 != '\0') {
        pcVar5 = pcVar5 + 1;
        if (cVar2 == *pcVar3) goto LAB_002363a0;
      }
      pcVar3 = pcVar1;
    } while (slen != 0);
  }
LAB_002363a0:
  return (long)pcVar3 - (long)s;
}

Assistant:

size_t memcspn(const char* s, size_t slen, const char* reject) {
  const char* p = s;
  const char* spanp;
  char c, sc;

  while (slen-- != 0) {
    c = *p++;
    for (spanp = reject; (sc = *spanp++) != '\0';)
      if (sc == c) return p - 1 - s;
  }
  return p - s;
}